

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O1

void Ssw_MatchingExtend(Aig_Man_t *p0,Aig_Man_t *p1,int nDist,int fVerbose)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  uint uVar4;
  Vec_Ptr_t *vNodes;
  void **ppvVar5;
  Vec_Ptr_t *vNodes_00;
  uint uVar6;
  long lVar7;
  Aig_Man_t *pAVar8;
  int iVar9;
  
  Aig_ManFanoutStart(p0);
  Aig_ManFanoutStart(p1);
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 1000;
  vNodes->nSize = 0;
  ppvVar5 = (void **)malloc(8000);
  vNodes->pArray = ppvVar5;
  vNodes_00 = (Vec_Ptr_t *)malloc(0x10);
  vNodes_00->nCap = 1000;
  vNodes_00->nSize = 0;
  ppvVar5 = (void **)malloc(8000);
  vNodes_00->pArray = ppvVar5;
  if (fVerbose != 0) {
    pAVar8 = p0;
    uVar4 = Ssw_MatchingCountUnmached(p0);
    iVar9 = (int)pAVar8;
    Abc_Print(iVar9,"Extending islands by %d steps:\n",(ulong)(uint)nDist);
    uVar6 = p0->nObjs[5] + p0->nObjs[2] + p0->nObjs[6];
    Abc_Print(iVar9,"%2d : Total = %6d. Unmatched = %6d.  Ratio = %6.2f %%\n",
              ((double)(int)uVar4 * 100.0) / (double)(int)uVar6,0,(ulong)uVar6,(ulong)uVar4);
  }
  if (0 < nDist) {
    iVar9 = 0;
    do {
      Ssw_MatchingExtendOne(p0,vNodes);
      Ssw_MatchingExtendOne(p1,vNodes_00);
      iVar1 = vNodes->nSize;
      if (0 < (long)iVar1) {
        ppvVar5 = vNodes->pArray;
        lVar7 = 0;
        do {
          pvVar2 = ppvVar5[lVar7];
          piVar3 = *(int **)((long)pvVar2 + 0x28);
          if (piVar3 != (int *)0x0) {
            if (*(void **)(piVar3 + 10) != pvVar2) {
              __assert_fail("pNext1->pData == pNext0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                            ,0xf5,"void Ssw_MatchingExtend(Aig_Man_t *, Aig_Man_t *, int, int)");
            }
            if (((piVar3[6] & 7U) != 2) || (p0->nTruePis <= *piVar3)) {
              *(undefined8 *)((long)pvVar2 + 0x28) = 0;
              piVar3[10] = 0;
              piVar3[0xb] = 0;
            }
          }
          lVar7 = lVar7 + 1;
        } while (iVar1 != lVar7);
      }
      iVar1 = vNodes_00->nSize;
      if (0 < (long)iVar1) {
        ppvVar5 = vNodes_00->pArray;
        lVar7 = 0;
        do {
          pvVar2 = ppvVar5[lVar7];
          piVar3 = *(int **)((long)pvVar2 + 0x28);
          if (piVar3 != (int *)0x0) {
            if (*(void **)(piVar3 + 10) != pvVar2) {
              __assert_fail("pNext1->pData == pNext0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                            ,0x100,"void Ssw_MatchingExtend(Aig_Man_t *, Aig_Man_t *, int, int)");
            }
            if (((piVar3[6] & 7U) != 2) || (p1->nTruePis <= *piVar3)) {
              *(undefined8 *)((long)pvVar2 + 0x28) = 0;
              piVar3[10] = 0;
              piVar3[0xb] = 0;
            }
          }
          lVar7 = lVar7 + 1;
        } while (iVar1 != lVar7);
      }
      if (fVerbose != 0) {
        pAVar8 = p0;
        uVar4 = Ssw_MatchingCountUnmached(p0);
        uVar6 = p0->nObjs[5] + p0->nObjs[2] + p0->nObjs[6];
        Abc_Print((int)pAVar8,"%2d : Total = %6d. Unmatched = %6d.  Ratio = %6.2f %%\n",
                  ((double)(int)uVar4 * 100.0) / (double)(int)uVar6,(ulong)(iVar9 + 1),(ulong)uVar6,
                  (ulong)uVar4);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != nDist);
  }
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  if (vNodes_00->pArray != (void **)0x0) {
    free(vNodes_00->pArray);
    vNodes_00->pArray = (void **)0x0;
  }
  free(vNodes_00);
  Aig_ManFanoutStop(p0);
  Aig_ManFanoutStop(p1);
  return;
}

Assistant:

void Ssw_MatchingExtend( Aig_Man_t * p0, Aig_Man_t * p1, int nDist, int fVerbose )
{
    Vec_Ptr_t * vNodes0, * vNodes1;
    Aig_Obj_t * pNext0, * pNext1;
    int d, k;
    Aig_ManFanoutStart(p0);
    Aig_ManFanoutStart(p1);
    vNodes0 = Vec_PtrAlloc( 1000 );
    vNodes1 = Vec_PtrAlloc( 1000 );
    if ( fVerbose )
    {
        int nUnmached = Ssw_MatchingCountUnmached(p0);
        Abc_Print( 1, "Extending islands by %d steps:\n", nDist );
        Abc_Print( 1, "%2d : Total = %6d. Unmatched = %6d.  Ratio = %6.2f %%\n",
            0, Aig_ManCiNum(p0) + Aig_ManNodeNum(p0),
            nUnmached, 100.0 * nUnmached/(Aig_ManCiNum(p0) + Aig_ManNodeNum(p0)) );
    }
    for ( d = 0; d < nDist; d++ )
    {
        Ssw_MatchingExtendOne( p0, vNodes0 );
        Ssw_MatchingExtendOne( p1, vNodes1 );
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pNext0, k )
        {
            pNext1 = (Aig_Obj_t *)pNext0->pData;
            if ( pNext1 == NULL )
                continue;
            assert( pNext1->pData == pNext0 );
            if ( Saig_ObjIsPi(p0, pNext1) )
                continue;
            pNext0->pData = NULL;
            pNext1->pData = NULL;
        }
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pNext0, k )
        {
            pNext1 = (Aig_Obj_t *)pNext0->pData;
            if ( pNext1 == NULL )
                continue;
            assert( pNext1->pData == pNext0 );
            if ( Saig_ObjIsPi(p1, pNext1) )
                continue;
            pNext0->pData = NULL;
            pNext1->pData = NULL;
        }
        if ( fVerbose )
        {
            int nUnmached = Ssw_MatchingCountUnmached(p0);
            Abc_Print( 1, "%2d : Total = %6d. Unmatched = %6d.  Ratio = %6.2f %%\n",
                d+1, Aig_ManCiNum(p0) + Aig_ManNodeNum(p0),
                nUnmached, 100.0 * nUnmached/(Aig_ManCiNum(p0) + Aig_ManNodeNum(p0)) );
        }
    }
    Vec_PtrFree( vNodes0 );
    Vec_PtrFree( vNodes1 );
    Aig_ManFanoutStop(p0);
    Aig_ManFanoutStop(p1);
}